

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mathFuncs.cpp
# Opt level: O1

float divide(float x,float y)

{
  ostream *poVar1;
  
  poVar1 = std::ostream::_M_insert<double>((double)x);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," / ",3);
  poVar1 = std::ostream::_M_insert<double>((double)y);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return x / y;
}

Assistant:

float
divide (float x, float y)
{
    std::cout << x << " / " << y << std::endl;
    return x / y;
}